

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O1

MockExpectedCall * __thiscall
MockSupport::expectNCalls(MockSupport *this,uint amount,SimpleString *functionName)

{
  UtestShell *this_00;
  MockCheckedExpectedCall *this_01;
  MockExpectedCall *pMVar1;
  SimpleString SVar2;
  
  if (this->enabled_ != false) {
    this_00 = UtestShell::getCurrent();
    UtestShell::countCheck(this_00);
    this_01 = (MockCheckedExpectedCall *)
              operator_new(0xa0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockSupport.cpp"
                           ,0xae);
    MockCheckedExpectedCall::MockCheckedExpectedCall(this_01,amount);
    SVar2 = appendScopeToName((MockSupport *)&stack0xffffffffffffffc8,(SimpleString *)this);
    (*(this_01->super_MockExpectedCall)._vptr_MockExpectedCall[2])
              (this_01,&stack0xffffffffffffffc8,SVar2.bufferSize_);
    SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffc8);
    if (this->strictOrdering_ == true) {
      (*(this_01->super_MockExpectedCall)._vptr_MockExpectedCall[4])
                (this_01,(ulong)(this->expectedCallOrder_ + 1),
                 (ulong)(this->expectedCallOrder_ + amount));
      this->expectedCallOrder_ = this->expectedCallOrder_ + amount;
    }
    MockExpectedCallsList::addExpectedCall(&this->expectations_,this_01);
    return &this_01->super_MockExpectedCall;
  }
  pMVar1 = MockIgnoredExpectedCall::instance();
  return pMVar1;
}

Assistant:

MockExpectedCall& MockSupport::expectNCalls(unsigned int amount, const SimpleString& functionName)
{
    if (!enabled_) return MockIgnoredExpectedCall::instance();

    countCheck();

    MockCheckedExpectedCall* call = new MockCheckedExpectedCall(amount);
    call->withName(appendScopeToName(functionName));
    if (strictOrdering_) {
        call->withCallOrder(expectedCallOrder_ + 1, expectedCallOrder_ + amount);
        expectedCallOrder_ += amount;
    }
    expectations_.addExpectedCall(call);
    return *call;
}